

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

void ts_parser_delete(TSParser *self)

{
  ts_stack_delete(self->stack);
  if ((self->reduce_actions).contents != (ReduceAction *)0x0) {
    array__delete((VoidArray *)&self->reduce_actions);
  }
  if ((self->included_range_differences).contents != (TSRange *)0x0) {
    array__delete((VoidArray *)&self->included_range_differences);
  }
  if ((self->old_tree).ptr != (SubtreeHeapData *)0x0) {
    ts_subtree_release(&self->tree_pool,self->old_tree);
    (self->old_tree).ptr = (SubtreeHeapData *)0x0;
  }
  ts_lexer_delete(&self->lexer);
  ts_parser__set_cached_token(self,0,(Subtree)0x0,(Subtree)0x0);
  ts_subtree_pool_delete(&self->tree_pool);
  array__delete((VoidArray *)&self->reusable_node);
  ts_parser_set_language(self,(TSLanguage *)0x0);
  free(self);
  return;
}

Assistant:

void ts_parser_delete(TSParser *self) {
  ts_stack_delete(self->stack);
  if (self->reduce_actions.contents) {
    array_delete(&self->reduce_actions);
  }
  if (self->included_range_differences.contents) {
    array_delete(&self->included_range_differences);
  }
  if (self->old_tree.ptr) {
    ts_subtree_release(&self->tree_pool, self->old_tree);
    self->old_tree = NULL_SUBTREE;
  }
  ts_lexer_delete(&self->lexer);
  ts_parser__set_cached_token(self, 0, NULL_SUBTREE, NULL_SUBTREE);
  ts_subtree_pool_delete(&self->tree_pool);
  reusable_node_delete(&self->reusable_node);
  ts_parser_set_language(self, NULL);
  ts_free(self);
}